

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O2

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::make_constraint<spvtools::opt::DependenceNone>
          (LoopDependenceAnalysis *this)

{
  __uniq_ptr_impl<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>
  local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
  .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>)
       operator_new(0x10);
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
                  .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl + 8) = 0;
  *(undefined ***)
   local_20._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
   .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl = &PTR_GetType_003b6380;
  std::__cxx11::
  list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::push_back(&this->constraints_,(value_type *)&local_20);
  if ((_Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
        .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl != (Constraint *)0x0
     ) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
                          .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl +
                0x10))();
  }
  return (Constraint *)
         (this->constraints_).
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }